

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O2

void KeccakP1600_DisplayRoundConstants(FILE *f)

{
  ulong uVar1;
  ulong uVar2;
  tKeccakLane *ptVar3;
  
  ptVar3 = KeccakRoundConstants;
  for (uVar2 = 0; uVar2 != 0x18; uVar2 = uVar2 + 1) {
    fprintf((FILE *)f,"RC[%02i][0][0] = ",uVar2 & 0xffffffff);
    uVar1 = *ptVar3;
    fprintf((FILE *)f,"%08X",uVar1 >> 0x20);
    fprintf((FILE *)f,"%08X",uVar1 & 0xffffffff);
    fputc(10,(FILE *)f);
    ptVar3 = ptVar3 + 1;
  }
  fputc(10,(FILE *)f);
  return;
}

Assistant:

void KeccakP1600_DisplayRoundConstants(FILE *f)
{
    unsigned int i;

    for(i=0; i<maxNrRounds; i++) {
        fprintf(f, "RC[%02i][0][0] = ", i);
        fprintf(f, "%08X", (unsigned int)(KeccakRoundConstants[i] >> 32));
        fprintf(f, "%08X", (unsigned int)(KeccakRoundConstants[i] & 0xFFFFFFFFULL));
        fprintf(f, "\n");
    }
    fprintf(f, "\n");
}